

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

bool P_CheckSight(AActor *t1,AActor *t2,int flags)

{
  sector_t_conflict *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  sector_t_conflict *psVar4;
  sector_t_conflict *psVar5;
  long lVar6;
  FRandom *this_00;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  sector_t_conflict *sec;
  SightTask task;
  SightCheck s;
  
  cycle_t::Clock(&SightCycles);
  if (t1 == (AActor *)0x0) {
    __assert_fail("t1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x32f,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  if (t2 == (AActor *)0x0) {
    __assert_fail("t2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x330,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  psVar5 = (sector_t_conflict *)t1->Sector;
  this = (sector_t_conflict *)t2->Sector;
  if ((rejectmatrix == (BYTE *)0x0) ||
     (uVar2 = (int)(((long)this - (long)sectors) / 0x218) +
              (int)(((long)psVar5 - (long)sectors) / 0x218) * numsectors,
     (rejectmatrix[(int)uVar2 >> 3] >> (uVar2 & 7) & 1) == 0)) {
    if (((flags & 1U) == 0) &&
       ((((t2->renderflags).Value & 0x8000) != 0 ||
        (bVar1 = FRenderStyle::IsVisible((FRenderStyle *)&(t2->RenderStyle).field_0,t2->Alpha),
        !bVar1)))) {
      this_00 = &pr_checksight;
      if (bglobal.m_Thinking != false) {
        this_00 = &pr_botchecksight;
      }
      iVar3 = FRandom::operator()(this_00);
      if (0x32 < iVar3) goto LAB_0044edae;
    }
    if (((flags & 8U) != 0) ||
       (((psVar4 = sector_t::GetHeightSec(psVar5), psVar4 == (sector_t_conflict *)0x0 ||
         (((dVar11 = (t1->__Pos).Z, dVar10 = t1->Height,
           dVar9 = secplane_t::ZatPoint(&psVar5->heightsec->floorplane,t1), dVar9 < dVar11 + dVar10
           || (dVar11 = (t2->__Pos).Z,
              dVar10 = secplane_t::ZatPoint(&psVar5->heightsec->floorplane,t2), dVar11 < dVar10)) &&
          ((dVar11 = (t1->__Pos).Z,
           dVar10 = secplane_t::ZatPoint(&psVar5->heightsec->ceilingplane,t1), dVar11 < dVar10 ||
           (dVar11 = (t2->__Pos).Z, dVar10 = t2->Height,
           dVar9 = secplane_t::ZatPoint(&psVar5->heightsec->ceilingplane,t2),
           dVar9 < dVar11 + dVar10)))))) &&
        ((psVar5 = sector_t::GetHeightSec(this), psVar5 == (sector_t_conflict *)0x0 ||
         (((dVar11 = (t2->__Pos).Z, dVar10 = t2->Height,
           dVar9 = secplane_t::ZatPoint(&this->heightsec->floorplane,t2), dVar9 < dVar11 + dVar10 ||
           (dVar11 = (t1->__Pos).Z, dVar10 = secplane_t::ZatPoint(&this->heightsec->floorplane,t1),
           dVar11 < dVar10)) &&
          ((dVar11 = (t2->__Pos).Z, dVar10 = secplane_t::ZatPoint(&this->heightsec->ceilingplane,t2)
           , dVar11 < dVar10 ||
           (dVar11 = (t1->__Pos).Z, dVar10 = t1->Height,
           dVar9 = secplane_t::ZatPoint(&this->heightsec->ceilingplane,t1), dVar9 < dVar11 + dVar10)
           ))))))))) {
      validcount = validcount + 1;
      TArray<SightTask,_SightTask>::Clear(&portals);
      dVar11 = t1->Height * 0.75 + (t1->__Pos).Z;
      AActor::GetPortalTransition(&s.sightstart,t1,dVar11,(sector_t **)&sec);
      task.bottomslope = (t2->__Pos).Z - dVar11;
      task.topslope = t2->Height + task.bottomslope;
      task.Frac = 0.0;
      task.direction = -1;
      task.portalgroup = sec->PortalGroup;
      SightCheck::init(&s,(EVP_PKEY_CTX *)t1);
      bVar1 = SightCheck::P_SightPathTraverse(&s);
      bVar8 = true;
      if (!bVar1) {
        dVar11 = AActor::Distance2D(t1,t2,false);
        uVar7 = 0xffffffffffffffff;
        lVar6 = 0;
        do {
          uVar7 = uVar7 + 1;
          bVar8 = uVar7 < portals.Count;
          if (!bVar8) break;
          *(double *)((long)&(portals.Array)->Frac + lVar6) =
               *(double *)((long)&(portals.Array)->Frac + lVar6) + 1.0 / dVar11;
          SightCheck::init(&s,(EVP_PKEY_CTX *)t1);
          bVar1 = SightCheck::P_SightPathTraverse(&s);
          lVar6 = lVar6 + 0x20;
        } while (!bVar1);
      }
      goto LAB_0044edb0;
    }
  }
  else {
    sightcounts[0] = sightcounts[0] + 1;
  }
LAB_0044edae:
  bVar8 = false;
LAB_0044edb0:
  cycle_t::Unclock(&SightCycles);
  return bVar8;
}

Assistant:

bool P_CheckSight (AActor *t1, AActor *t2, int flags)
{
	SightCycles.Clock();

	bool res;

	assert (t1 != NULL);
	assert (t2 != NULL);
	if (t1 == NULL || t2 == NULL)
	{
		return false;
	}

	const sector_t *s1 = t1->Sector;
	const sector_t *s2 = t2->Sector;
	int pnum = int(s1 - sectors) * numsectors + int(s2 - sectors);

//
// check for trivial rejection
//
	if (rejectmatrix != NULL &&
		(rejectmatrix[pnum>>3] & (1 << (pnum & 7))))
	{
sightcounts[0]++;
		res = false;			// can't possibly be connected
		goto done;
	}

//
// check precisely
//
	// [RH] Andy Baker's stealth monsters:
	// Cannot see an invisible object
	if ((flags & SF_IGNOREVISIBILITY) == 0 && ((t2->renderflags & RF_INVISIBLE) || !t2->RenderStyle.IsVisible(t2->Alpha)))
	{ // small chance of an attack being made anyway
		if ((bglobal.m_Thinking ? pr_botchecksight() : pr_checksight()) > 50)
		{
			res = false;
			goto done;
		}
	}

	// killough 4/19/98: make fake floors and ceilings block monster view

	if (!(flags & SF_IGNOREWATERBOUNDARY))
	{
		if ((s1->GetHeightSec() &&
			((t1->Top() <= s1->heightsec->floorplane.ZatPoint(t1) &&
			  t2->Z() >= s1->heightsec->floorplane.ZatPoint(t2)) ||
			 (t1->Z() >= s1->heightsec->ceilingplane.ZatPoint(t1) &&
			  t2->Top() <= s1->heightsec->ceilingplane.ZatPoint(t2))))
			||
			(s2->GetHeightSec() &&
			 ((t2->Top() <= s2->heightsec->floorplane.ZatPoint(t2) &&
			   t1->Z() >= s2->heightsec->floorplane.ZatPoint(t1)) ||
			  (t2->Z() >= s2->heightsec->ceilingplane.ZatPoint(t2) &&
			   t1->Top() <= s2->heightsec->ceilingplane.ZatPoint(t1)))))
		{
			res = false;
			goto done;
		}
	}

	// An unobstructed LOS is possible.
	// Now look from eyes of t1 to any part of t2.

	validcount++;
	portals.Clear();
	{
		sector_t *sec;
		double lookheight = t1->Z() + t1->Height*0.75;
		t1->GetPortalTransition(lookheight, &sec);

		double bottomslope = t2->Z() - lookheight;
		double topslope = bottomslope + t2->Height;
		SightTask task = { 0, topslope, bottomslope, -1, sec->PortalGroup };


		SightCheck s;
		s.init(t1, t2, sec, &task, flags);
		res = s.P_SightPathTraverse ();
		if (!res)
		{
			double dist = t1->Distance2D(t2);
			for (unsigned i = 0; i < portals.Size(); i++)
			{
				portals[i].Frac += 1 / dist;
				s.init(t1, t2, NULL, &portals[i], flags);
				if (s.P_SightPathTraverse())
				{
					res = true;
					break;
				}
			}
		}
	}

done:
	SightCycles.Unclock();
	return res;
}